

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_from_bytes_int(ptrlen bytes,size_t m,size_t c)

{
  ulong *puVar1;
  BignumInt *pBVar2;
  mp_int *pmVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  
  uVar5 = bytes.len;
  uVar6 = uVar5 + 7 >> 3;
  pmVar3 = mp_make_sized(uVar6 + (uVar6 == 0));
  if (uVar5 != 0) {
    pbVar7 = (byte *)((long)bytes.ptr + c);
    pBVar2 = pmVar3->w;
    bVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (ulong *)((long)pBVar2 + (uVar6 & 0xfffffffffffffff8));
      *puVar1 = *puVar1 | (ulong)*pbVar7 << (bVar4 & 0x38);
      uVar6 = uVar6 + 1;
      pbVar7 = pbVar7 + m;
      bVar4 = bVar4 + 8;
    } while (uVar5 != uVar6);
  }
  return pmVar3;
}

Assistant:

static mp_int *mp_from_bytes_int(ptrlen bytes, size_t m, size_t c)
{
    size_t nw = (bytes.len + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES;
    nw = size_t_max(nw, 1);
    mp_int *n = mp_make_sized(nw);
    for (size_t i = 0; i < bytes.len; i++)
        n->w[i / BIGNUM_INT_BYTES] |=
            (BignumInt)(((const unsigned char *)bytes.ptr)[m*i+c]) <<
            (8 * (i % BIGNUM_INT_BYTES));
    return n;
}